

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicsLinearization.cpp
# Opt level: O3

void __thiscall
iDynTree::ForwardDynamicsLinearizationInternalBuffers::ForwardDynamicsLinearizationInternalBuffers
          (ForwardDynamicsLinearizationInternalBuffers *this,Model *model)

{
  ArticulatedBodyAlgorithmInternalBuffers::ArticulatedBodyAlgorithmInternalBuffers(&this->aba);
  (this->dPos).
  super__Vector_base<iDynTree::ArticulatedBodyAlgorithmInternalBuffers,_std::allocator<iDynTree::ArticulatedBodyAlgorithmInternalBuffers>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dPos).
  super__Vector_base<iDynTree::ArticulatedBodyAlgorithmInternalBuffers,_std::allocator<iDynTree::ArticulatedBodyAlgorithmInternalBuffers>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dPos).
  super__Vector_base<iDynTree::ArticulatedBodyAlgorithmInternalBuffers,_std::allocator<iDynTree::ArticulatedBodyAlgorithmInternalBuffers>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LinkPositions::LinkPositions(&this->linkPos,0);
  memset(&this->dVb_linkBiasWrench,0,0x90);
  resize(this,model);
  return;
}

Assistant:

ForwardDynamicsLinearizationInternalBuffers::ForwardDynamicsLinearizationInternalBuffers(const Model& model)
{
    resize(model);
}